

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasm.c
# Opt level: O0

int disasm_jnb_bitaddr_offset(em8051 *aCPU,int aPosition,char *aBuffer)

{
  char local_38 [8];
  char baddr [16];
  char *aBuffer_local;
  int aPosition_local;
  em8051 *aCPU_local;
  
  bitaddr_memonic((uint)aCPU->mCodeMem[(int)(aPosition + 1U & aCPU->mCodeMemSize - 1U)],local_38);
  sprintf(aBuffer,"JNB   %s, #%+d",local_38,
          (ulong)(uint)(int)(char)aCPU->mCodeMem[(int)(aPosition + 2U & aCPU->mCodeMemSize - 1U)]);
  return 3;
}

Assistant:

static int disasm_jnb_bitaddr_offset(struct em8051 *aCPU, int aPosition, char *aBuffer)
{
    char baddr[16];
    bitaddr_memonic(aCPU->mCodeMem[(aPosition + 1)&(aCPU->mCodeMemSize-1)], baddr);
    sprintf(aBuffer,"JNB   %s, #%+d",        
        baddr,
        (signed char)aCPU->mCodeMem[(aPosition + 2)&(aCPU->mCodeMemSize-1)]);
    return 3;
}